

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::SystemTools::Strucmp(char *l,char *r)

{
  int iVar1;
  int iVar2;
  bool local_21;
  int rc;
  int lc;
  char *r_local;
  char *l_local;
  
  _rc = r;
  r_local = l;
  do {
    iVar1 = tolower((int)*r_local);
    iVar2 = tolower((int)*_rc);
    local_21 = iVar1 == iVar2 && iVar1 != 0;
    _rc = _rc + 1;
    r_local = r_local + 1;
  } while (local_21);
  return iVar1 - iVar2;
}

Assistant:

int SystemTools::Strucmp(const char* l, const char* r)
{
  int lc;
  int rc;
  do {
    lc = tolower(*l++);
    rc = tolower(*r++);
  } while (lc == rc && lc);
  return lc - rc;
}